

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void dill_assoc_client_data(dill_exec_ctx ec,int key,long value)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  client_data_struct *pcVar5;
  intptr_t *piVar6;
  ulong uVar7;
  
  uVar1 = ec->client_data_count;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  lVar3 = 0;
  do {
    lVar4 = lVar3;
    if (uVar7 * 0x10 + 0x10 == lVar4 + 0x10) {
      if (uVar1 == 0) {
        pcVar5 = (client_data_struct *)dill_malloc(0x10);
      }
      else {
        pcVar5 = (client_data_struct *)dill_realloc(ec->client_data,(long)(int)uVar1 * 0x10 + 0x10);
      }
      ec->client_data = pcVar5;
      iVar2 = ec->client_data_count;
      piVar6 = &pcVar5[iVar2].value;
      pcVar5[iVar2].key = key;
      ec->client_data_count = iVar2 + 1;
      goto LAB_0010ffd4;
    }
    lVar3 = lVar4 + 0x10;
  } while (*(int *)((long)&ec->client_data->key + lVar4) != key);
  piVar6 = (intptr_t *)((long)&ec->client_data->value + lVar4);
LAB_0010ffd4:
  *piVar6 = value;
  return;
}

Assistant:

extern void
dill_assoc_client_data(dill_exec_ctx ec, int key, IMM_TYPE value)
{
    int i = 0;
    for (i = 0; i < ec->client_data_count; i++) {
        if (ec->client_data[i].key == key) {
            ec->client_data[i].value = value;
            return;
        }
    }
    if (ec->client_data_count == 0) {
        ec->client_data = malloc(sizeof(struct client_data_struct));
    } else {
        ec->client_data =
            realloc(ec->client_data, sizeof(struct client_data_struct) *
                                         (ec->client_data_count + 1));
    }
    ec->client_data[ec->client_data_count].key = key;
    ec->client_data[ec->client_data_count++].value = value;
}